

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec07.c
# Opt level: O0

int If_Dec6DeriveCount2(word t,int *pCof0,int *pCof1)

{
  undefined4 local_28;
  undefined4 local_24;
  int Mask;
  int i;
  int *pCof1_local;
  int *pCof0_local;
  word t_local;
  
  local_28 = 0;
  *pCof0 = (uint)t & 0xf;
  *pCof1 = (uint)t & 0xf;
  for (local_24 = 1; local_24 < 0x10; local_24 = local_24 + 1) {
    if ((long)*pCof0 != (t >> ((byte)(local_24 << 2) & 0x3f) & 0xf)) {
      *pCof1 = (uint)(t >> ((byte)(local_24 << 2) & 0x3f)) & 0xf;
      local_28 = 1 << ((byte)local_24 & 0x1f) | local_28;
    }
  }
  return local_28;
}

Assistant:

static inline int If_Dec6DeriveCount2( word t, int * pCof0, int * pCof1 )
{
    int i, Mask = 0;
    *pCof0 = (t & 15);
    *pCof1 = (t & 15);
    for ( i = 1; i < 16; i++ )
        if ( *pCof0 != ((t >> (i<<2)) & 15) )
        {
            *pCof1 = ((t >> (i<<2)) & 15);
            Mask |= (1 << i);
        }
    return Mask;
}